

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_point.cpp
# Opt level: O1

ON_2dPoint __thiscall
ON_PeriodicDomain::LiftToCover(ON_PeriodicDomain *this,ON_2dPoint Pin,bool stealth)

{
  double dVar1;
  int i;
  int iVar2;
  bool *pbVar3;
  long lVar4;
  double dVar5;
  undefined8 in_XMM0_Qb;
  double dVar6;
  undefined8 uVar7;
  double in_XMM6_Qa;
  double dVar8;
  double dVar9;
  double in_XMM7_Qa;
  double dVar10;
  ON_2dPoint OVar11;
  int deck [2];
  int deck_in [2];
  int local_68 [2];
  double local_60;
  int local_58 [2];
  double local_50;
  double local_48;
  double local_40;
  double local_38;
  undefined8 uStack_30;
  
  local_60 = Pin.y;
  dVar5 = Pin.x;
  local_58[0] = 0;
  local_58[1] = 0;
  pbVar3 = this->m_closed;
  lVar4 = 0;
  local_50 = dVar5;
  do {
    dVar6 = dVar5;
    uVar7 = in_XMM0_Qb;
    if (lVar4 != 0) {
      uVar7 = 0;
      dVar6 = local_60;
    }
    local_38 = -1.23432101234321e+308;
    uStack_30 = 0;
    if (ABS(dVar6) < 1.23432101234321e+308) {
      dVar8 = *(double *)((long)this->m_dom[0].m_t + lVar4 * 4);
      dVar1 = *(double *)((long)this->m_dom[0].m_t + lVar4 * 4 + 8);
      if ((dVar8 != dVar1) || (NAN(dVar8) || NAN(dVar1))) {
        local_38 = (double)(-(ulong)(dVar1 == dVar6) & 0x3ff0000000000000 |
                           ~-(ulong)(dVar1 == dVar6) & (ulong)((dVar6 - dVar8) / (dVar1 - dVar8)));
        uStack_30 = uVar7;
      }
      else {
        local_38 = 0.0;
        uStack_30 = 0;
      }
    }
    local_48 = in_XMM7_Qa;
    dVar6 = local_38;
    if (lVar4 != 0) {
      local_48 = local_38;
      dVar6 = in_XMM6_Qa;
    }
    if (*pbVar3 == true) {
      local_48 = in_XMM7_Qa;
      local_40 = in_XMM6_Qa;
      dVar5 = floor(local_38);
      *(int *)((long)local_58 + lVar4) = (int)dVar5;
      dVar6 = local_38 - (double)(int)dVar5;
      if (lVar4 != 0) {
        local_48 = dVar6;
        dVar6 = local_40;
      }
      in_XMM0_Qb = 0;
      dVar5 = local_50;
    }
    in_XMM6_Qa = dVar6;
    lVar4 = lVar4 + 4;
    pbVar3 = pbVar3 + 1;
    in_XMM7_Qa = local_48;
  } while (lVar4 == 4);
  dVar6 = (this->m_nprev).x;
  if ((dVar6 == ON_2dPoint::UnsetPoint.x) && (!NAN(dVar6) && !NAN(ON_2dPoint::UnsetPoint.x))) {
    dVar6 = (this->m_nprev).y;
    if ((dVar6 == ON_2dPoint::UnsetPoint.y) && (!NAN(dVar6) && !NAN(ON_2dPoint::UnsetPoint.y))) {
      if (!stealth) {
        (this->m_nprev).x = in_XMM6_Qa;
        (this->m_nprev).y = local_48;
        this->m_deck[0] = local_58[0];
        this->m_deck[1] = local_58[1];
      }
      goto LAB_0058ae3d;
    }
  }
  local_68[0] = this->m_deck[0];
  local_68[1] = this->m_deck[1];
  dVar6 = this->m_normband;
  lVar4 = 0;
  do {
    if (this->m_closed[lVar4] == true) {
      dVar8 = in_XMM6_Qa;
      if (lVar4 != 0) {
        dVar8 = local_48;
      }
      if ((dVar6 <= *(double *)(this->m_deck + (ulong)(lVar4 != 0) * 2 + 2)) ||
         (iVar2 = -1, dVar8 <= 1.0 - dVar6)) {
        dVar8 = in_XMM6_Qa;
        if (lVar4 != 0) {
          dVar8 = local_48;
        }
        if ((*(double *)(this->m_deck + (ulong)(lVar4 != 0) * 2 + 2) <= 1.0 - dVar6) ||
           (iVar2 = 1, dVar6 <= dVar8)) goto LAB_0058ad79;
      }
      local_68[lVar4] = local_68[lVar4] + iVar2;
    }
LAB_0058ad79:
    lVar4 = lVar4 + 1;
  } while (lVar4 == 1);
  lVar4 = 0;
  dVar6 = dVar5;
  do {
    dVar5 = in_XMM6_Qa;
    if (lVar4 != 0) {
      dVar5 = local_48;
    }
    dVar5 = (double)*(int *)((long)local_68 + lVar4) + dVar5;
    dVar8 = *(double *)((long)this->m_dom[0].m_t + lVar4 * 4);
    dVar1 = *(double *)((long)this->m_dom[0].m_t + lVar4 * 4 + 8);
    dVar10 = dVar5;
    if ((dVar8 == dVar1) && (!NAN(dVar8) && !NAN(dVar1))) {
      dVar10 = 0.0;
    }
    dVar9 = (1.0 - dVar10) * dVar8 + dVar1 * dVar10;
    dVar10 = (double)(~-(ulong)(ABS(dVar5) < 1.23432101234321e+308) & 0xffe5f8bd9e331dd2 |
                     -(ulong)(ABS(dVar5) < 1.23432101234321e+308) & (ulong)dVar9);
    if ((dVar8 == dVar1) && (!NAN(dVar8) && !NAN(dVar1))) {
      dVar10 = dVar9;
    }
    dVar5 = dVar10;
    if (lVar4 != 0) {
      dVar5 = dVar6;
      local_60 = dVar10;
    }
    lVar4 = lVar4 + 4;
    dVar6 = dVar5;
  } while (lVar4 == 4);
  if (!stealth) {
    this->m_deck[0] = local_68[0];
    this->m_deck[1] = local_68[1];
    (this->m_nprev).x = in_XMM6_Qa;
    (this->m_nprev).y = local_48;
  }
LAB_0058ae3d:
  OVar11.y = local_60;
  OVar11.x = dVar5;
  return OVar11;
}

Assistant:

ON_2dPoint ON_PeriodicDomain::LiftToCover(ON_2dPoint Pin, bool stealth )
{
	ON_2dPoint out = Pin;
	ON_2dPoint nnext;
	int deck_in[2] = { 0,0 };
	//  decompose Pin
	//     Pin = m_dom.ParameterAt( deck + nnext)
	// where nnext[i] is in [0.0, 1.0)
	for (int i = 0; i < 2; i++)
	{
		nnext[i] = m_dom[i].NormalizedParameterAt(out[i]);
		if (m_closed[i])
		{
			deck_in[i] = int(floor(nnext[i]));
			nnext[i] -= deck_in[i];
		}
	}


	if (m_nprev == ON_2dPoint::UnsetPoint)
	{
		if( !stealth)
		{ 
			m_nprev = nnext;
			m_deck[0] = deck_in[0];
			m_deck[1] = deck_in[1];
		}
		return Pin;
	}

	int deck[2] = { m_deck[0], m_deck[1] };
	for (int i = 0; i < 2; i++)
	{
		if (!m_closed[i])
			continue;
		if (m_nprev[i]<m_normband &&  nnext[i]>1.0 - m_normband)
			deck[i] --;
		else if (m_nprev[i] > 1.0 - m_normband && nnext[i] < m_normband)
			deck[i]++;
	}

	for (int i = 0; i < 2; i++)
		out[i] = m_dom[i].ParameterAt(deck[i] + nnext[i]);
	
	if (!stealth)
	{
		m_deck[0] = deck[0]; 
		m_deck[1] = deck[1];
		m_nprev = nnext;
	}

	return out;
}